

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

pid_t testing::internal::ExecDeathTestFork(char **argv,int close_fd)

{
  bool bVar1;
  int iVar2;
  String *in_stack_ffffffffffffff50;
  String *this;
  void *local_a0;
  String local_88;
  String local_78;
  void *local_68;
  void *stack_top;
  String local_50;
  void *local_40;
  void *stack;
  size_t stack_size;
  bool use_fork;
  char **ppcStack_28;
  pid_t child_pid;
  ExecDeathTestArgs args;
  int close_fd_local;
  char **argv_local;
  
  stack_size._4_4_ = -1;
  stack_size._3_1_ = FLAGS_gtest_death_test_use_fork & 1;
  ppcStack_28 = argv;
  args.argv._0_4_ = close_fd;
  args._12_4_ = close_fd;
  if (stack_size._3_1_ == 0) {
    if ((ExecDeathTestFork(char_const**,int)::stack_grows_down == '\0') &&
       (iVar2 = __cxa_guard_acquire(&ExecDeathTestFork(char_const**,int)::stack_grows_down),
       iVar2 != 0)) {
      ExecDeathTestFork::stack_grows_down = StackGrowsDown();
      __cxa_guard_release(&ExecDeathTestFork(char_const**,int)::stack_grows_down);
    }
    iVar2 = getpagesize();
    stack = (void *)(long)iVar2;
    local_40 = mmap((void *)0x0,(size_t)stack,3,0x22,-1,0);
    do {
      bVar1 = IsTrue(local_40 != (void *)0xffffffffffffffff);
      if (!bVar1) {
        String::Format(&local_50,"CHECK failed: File %s, line %d: %s",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                       ,0x3c6,"stack != MAP_FAILED");
        DeathTestAbort(&local_50);
        String::~String(in_stack_ffffffffffffff50);
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    if ((ExecDeathTestFork::stack_grows_down & 1U) == 0) {
      local_a0 = (void *)0x0;
    }
    else {
      local_a0 = stack;
    }
    local_68 = (void *)((long)local_40 + (long)local_a0);
    stack_size._4_4_ = clone(ExecDeathTestChildMain,local_68,0x11,&stack0xffffffffffffffd8);
    do {
      iVar2 = munmap(local_40,(size_t)stack);
      bVar1 = IsTrue(iVar2 != -1);
      if (!bVar1) {
        String::Format(&local_78,"CHECK failed: File %s, line %d: %s",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                       ,0x3cc,"munmap(stack, stack_size) != -1");
        DeathTestAbort(&local_78);
        String::~String(in_stack_ffffffffffffff50);
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
  }
  if (((stack_size._3_1_ & 1) != 0) && (stack_size._4_4_ = fork(), stack_size._4_4_ == 0)) {
    ExecDeathTestChildMain(&stack0xffffffffffffffd8);
    _exit(0);
  }
  do {
    bVar1 = IsTrue(stack_size._4_4_ != -1);
    if (!bVar1) {
      this = &local_88;
      String::Format(this,"CHECK failed: File %s, line %d: %s",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                     ,0x3d7,"child_pid != -1");
      DeathTestAbort(this);
      String::~String(this);
    }
    bVar1 = AlwaysFalse();
  } while (bVar1);
  return stack_size._4_4_;
}

Assistant:

static pid_t ExecDeathTestFork(char* const* argv, int close_fd) {
  ExecDeathTestArgs args = { argv, close_fd };
  pid_t child_pid = -1;

#  if GTEST_HAS_CLONE
  const bool use_fork = GTEST_FLAG(death_test_use_fork);

  if (!use_fork) {
    static const bool stack_grows_down = StackGrowsDown();
    const size_t stack_size = getpagesize();
    // MMAP_ANONYMOUS is not defined on Mac, so we use MAP_ANON instead.
    void* const stack = mmap(NULL, stack_size, PROT_READ | PROT_WRITE,
                             MAP_ANON | MAP_PRIVATE, -1, 0);
    GTEST_DEATH_TEST_CHECK_(stack != MAP_FAILED);
    void* const stack_top =
        static_cast<char*>(stack) + (stack_grows_down ? stack_size : 0);

    child_pid = clone(&ExecDeathTestChildMain, stack_top, SIGCHLD, &args);

    GTEST_DEATH_TEST_CHECK_(munmap(stack, stack_size) != -1);
  }
#  else
  const bool use_fork = true;
#  endif  // GTEST_HAS_CLONE

  if (use_fork && (child_pid = fork()) == 0) {
      ExecDeathTestChildMain(&args);
      _exit(0);
  }

  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  return child_pid;
}